

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::FloatingPointLE<double>
          (internal *this,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *pAVar3;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar5;
  string local_3c0;
  string local_3a0;
  AssertionResult local_380;
  int local_36c;
  stringstream local_368 [8];
  stringstream val2_ss;
  ostream local_358 [396];
  int local_1cc;
  stringstream local_1c8 [8];
  stringstream val1_ss;
  ostream local_1b8 [376];
  FloatingPoint<double> local_40;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  double val2_local;
  double val1_local;
  char *expr2_local;
  char *expr1_local;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  
  lhs.u_ = (FloatingPointUnion)val2;
  val2_local = val1;
  val1_local = (double)expr2;
  expr2_local = expr1;
  expr1_local = (char *)this;
  if (val2 <= val1) {
    FloatingPoint<double>::FloatingPoint(&rhs,&val2_local);
    FloatingPoint<double>::FloatingPoint(&local_40,(double *)&lhs);
    bVar1 = FloatingPoint<double>::AlmostEquals(&rhs,&local_40);
    if (bVar1) {
      AVar5 = AssertionSuccess();
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar5.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1c8);
      local_1cc = (int)std::setprecision(0x11);
      poVar2 = std::operator<<(local_1b8,(_Setprecision)local_1cc);
      std::ostream::operator<<(poVar2,val2_local);
      std::__cxx11::stringstream::stringstream(local_368);
      local_36c = (int)std::setprecision(0x11);
      poVar2 = std::operator<<(local_358,(_Setprecision)local_36c);
      std::ostream::operator<<(poVar2,(double)lhs.u_);
      AssertionFailure();
      pAVar3 = AssertionResult::operator<<(&local_380,(char (*) [12])"Expected: (");
      pAVar3 = AssertionResult::operator<<(pAVar3,&expr2_local);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [7])") <= (");
      pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&val1_local);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x154006);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])0x15392a);
      StringStreamToString(&local_3a0,(stringstream *)local_1c8);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_3a0);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [5])" vs ");
      StringStreamToString(&local_3c0,(stringstream *)local_368);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_3c0);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar3);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3a0);
      AssertionResult::~AssertionResult(&local_380);
      std::__cxx11::stringstream::~stringstream(local_368);
      std::__cxx11::stringstream::~stringstream(local_1c8);
      _Var4._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  else {
    AVar5 = AssertionSuccess();
    _Var4._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar5.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var4._M_head_impl;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}